

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

uint32_t helper_trXX(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2,uint32_t tst,uint32_t sizes
                    )

{
  _Bool _Var1;
  uint wordsize;
  uint64_t uVar2;
  uint64_t addr;
  uint64_t uVar3;
  ulong uVar4;
  uint64_t length;
  uint wordsize_00;
  ulong v;
  int iVar5;
  uint32_t uVar6;
  uintptr_t unaff_retaddr;
  uint64_t local_78;
  
  wordsize_00 = 2 - (sizes & 1);
  wordsize = ((sizes & 2) == 0) + 1;
  uVar2 = get_address(env,1);
  local_78 = get_address(env,r1);
  v = (ulong)((uint)env->regs[(int)(r1 + 1)] & 0x7fffffff);
  if (((env->psw).mask >> 0x20 & 1) != 0) {
    v = env->regs[(int)(r1 + 1)];
  }
  addr = get_address(env,r2);
  if ((sizes & 2) == 0) {
    _Var1 = s390_has_feat(env->uc,S390_FEAT_ETF2_ENH);
    uVar4 = 0xfffffffffffff000;
    if (!_Var1) goto LAB_00ae24c2;
  }
  uVar4 = 0xfffffffffffffff8;
LAB_00ae24c2:
  check_alignment(env,v,wordsize,unaff_retaddr);
  length = v - wordsize * 0x2000;
  iVar5 = 0x2001;
  while( true ) {
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      uVar6 = 3;
      goto LAB_00ae25b2;
    }
    uVar3 = cpu_ldusize_data_ra(env,addr,wordsize,unaff_retaddr);
    uVar3 = cpu_ldusize_data_ra(env,(ulong)(((uint)uVar3 & 0xffff) << ((byte)(sizes & 1) ^ 1)) +
                                    (uVar2 & uVar4),wordsize_00,unaff_retaddr);
    if (((uint)uVar3 & 0xffff) == tst) break;
    cpu_stsize_data_ra(env,local_78,uVar3 & 0xffff,wordsize_00,unaff_retaddr);
    addr = addr + wordsize;
    local_78 = local_78 + wordsize_00;
    v = v - wordsize;
    if (v == 0) {
      uVar6 = 0;
      length = 0;
LAB_00ae25b2:
      set_address(env,r1,local_78);
      set_length(env,r1 + 1,length);
      set_address(env,r2,addr);
      return uVar6;
    }
  }
  uVar6 = 1;
  length = v;
  goto LAB_00ae25b2;
}

Assistant:

uint32_t HELPER(trXX)(CPUS390XState *env, uint32_t r1, uint32_t r2,
                      uint32_t tst, uint32_t sizes)
{
    uintptr_t ra = GETPC();
    int dsize = (sizes & 1) ? 1 : 2;
    int ssize = (sizes & 2) ? 1 : 2;
    uint64_t tbl = get_address(env, 1);
    uint64_t dst = get_address(env, r1);
    uint64_t len = get_length(env, r1 + 1);
    uint64_t src = get_address(env, r2);
    uint32_t cc = 3;
    int i;

    /* The lower address bits of TBL are ignored.  For TROO, TROT, it's
       the low 3 bits (double-word aligned).  For TRTO, TRTT, it's either
       the low 12 bits (4K, without ETF2-ENH) or 3 bits (with ETF2-ENH).  */
    if (ssize == 2 && !s390_has_feat(env->uc, S390_FEAT_ETF2_ENH)) {
        tbl &= -4096;
    } else {
        tbl &= -8;
    }

    check_alignment(env, len, ssize, ra);

    /* Lest we fail to service interrupts in a timely manner, */
    /* limit the amount of work we're willing to do.   */
    for (i = 0; i < 0x2000; i++) {
        uint16_t sval = cpu_ldusize_data_ra(env, src, ssize, ra);
        uint64_t tble = tbl + (sval * dsize);
        uint16_t dval = cpu_ldusize_data_ra(env, tble, dsize, ra);
        if (dval == tst) {
            cc = 1;
            break;
        }
        cpu_stsize_data_ra(env, dst, dval, dsize, ra);

        len -= ssize;
        src += ssize;
        dst += dsize;

        if (len == 0) {
            cc = 0;
            break;
        }
    }

    set_address(env, r1, dst);
    set_length(env, r1 + 1, len);
    set_address(env, r2, src);

    return cc;
}